

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall TTD::EventLog::UpdateComputedMode(EventLog *this)

{
  TTModeStack *this_00;
  uint32 uVar1;
  TTDMode TVar2;
  uint32 uVar3;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  ScriptContext **ppSVar4;
  TTDMode TVar5;
  int index;
  
  this_00 = &this->m_modeStack;
  uVar1 = TTModeStack::Count(this_00);
  if (uVar1 == 0) {
    TTDAbort_unrecoverable_error("Should never be empty!!!");
  }
  uVar1 = TTModeStack::Count(this_00);
  if (uVar1 == 0) {
    TVar2 = Invalid;
  }
  else {
    uVar1 = 0;
    TVar5 = Invalid;
    do {
      TVar2 = TTModeStack::GetAt(this_00,uVar1);
      if (0x3f < (int)TVar2) {
        if ((int)TVar2 < 0x400) {
          if ((TVar2 != ExcludedExecutionDebuggerAction) && (TVar2 != DebuggerSuppressGetter))
          goto switchD_008cf4d2_caseD_3;
        }
        else if ((TVar2 != DebuggerSuppressBreakpoints) && (TVar2 != DebuggerLogBreakpoints))
        goto switchD_008cf4d2_caseD_3;
        goto switchD_008cf4d2_caseD_1;
      }
      switch(TVar2) {
      case RecordMode:
      case ReplayMode:
        if (uVar1 != 0) {
          TTDAbort_unrecoverable_error("One of these should always be first on the stack.");
        }
        break;
      case RecordMode|CurrentlyEnabled:
      case ReplayMode|CurrentlyEnabled:
      case ReplayMode|RecordMode:
      case ReplayMode|RecordMode|CurrentlyEnabled:
switchD_008cf4d2_caseD_3:
        TTDAbort_unrecoverable_error("This mode is unknown or should never appear.");
      default:
        if (TVar2 != ExcludedExecutionTTAction) goto switchD_008cf4d2_caseD_3;
      case CurrentlyEnabled:
      case DebuggerAttachedMode:
switchD_008cf4d2_caseD_1:
        if (uVar1 == 0) {
          TTDAbort_unrecoverable_error("A base mode should always be first on the stack.");
        }
        TVar2 = TVar2 | TVar5;
      }
      uVar1 = uVar1 + 1;
      uVar3 = TTModeStack::Count(this_00);
      TVar5 = TVar2;
    } while (uVar1 < uVar3);
  }
  this->m_currentMode = TVar2;
  this_01 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
  if (0 < (this_01->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>)
          .count) {
    index = 0;
    do {
      ppSVar4 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&this_01->
                      super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,index);
      SetModeFlagsOnContext(this,*ppSVar4);
      index = index + 1;
    } while (index < (this_01->
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void EventLog::UpdateComputedMode()
    {
        TTDAssert(this->m_modeStack.Count() > 0, "Should never be empty!!!");

        TTDMode cm = TTDMode::Invalid;
        for(uint32 i = 0; i < this->m_modeStack.Count(); ++i)
        {
            TTDMode m = this->m_modeStack.GetAt(i);
            switch(m)
            {
            case TTDMode::RecordMode:
            case TTDMode::ReplayMode:
                TTDAssert(i == 0, "One of these should always be first on the stack.");
                cm = m;
                break;
            case TTDMode::DebuggerAttachedMode:
            case TTDMode::CurrentlyEnabled:
            case TTDMode::ExcludedExecutionTTAction:
            case TTDMode::ExcludedExecutionDebuggerAction:
            case TTDMode::DebuggerSuppressGetter:
            case TTDMode::DebuggerSuppressBreakpoints:
            case TTDMode::DebuggerLogBreakpoints:
                TTDAssert(i != 0, "A base mode should always be first on the stack.");
                cm |= m;
                break;
            default:
                TTDAssert(false, "This mode is unknown or should never appear.");
                break;
            }
        }

        this->m_currentMode = cm;

        //Set fast path values on ThreadContext
        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& contexts = this->m_threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < contexts.Count(); ++i)
        {
            this->SetModeFlagsOnContext(contexts.Item(i));
        }
    }